

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O2

bool __thiscall
om::file::simple_binary_reader<test_format>::next
          (simple_binary_reader<test_format> *this,test_format *t_)

{
  test_format *ptVar1;
  bool bVar2;
  
  if (this->_use_buffer == true) {
    ptVar1 = (this->_iter)._M_current;
    (this->_iter)._M_current = ptVar1 + 1;
    *t_ = *ptVar1;
  }
  else {
    std::istream::read((char *)&(this->super__file_stream)._stream,(long)t_);
  }
  bVar2 = done(this);
  return !bVar2;
}

Assistant:

bool next(T& t_)
			{
				if (_use_buffer)
					t_ = *(_iter++);
				else
					_stream.read((char*) &t_, sizeof(T));

				return !done();
			}